

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_string.cpp
# Opt level: O1

void duckdb::StringDecompressFunction<unsigned_short>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  VectorType VVar2;
  ushort uVar3;
  idx_t count;
  uint *puVar4;
  ushort *puVar5;
  unsigned_long *puVar6;
  string_t *psVar7;
  allocate_function_ptr_t p_Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  unsigned_short *ldata;
  byte bVar9;
  bool bVar10;
  element_type *peVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  SelectionVector *pSVar13;
  reference vector;
  VectorBuffer *pVVar14;
  ulong uVar15;
  TemplatedValidityData<unsigned_long> *pTVar16;
  idx_t iVar17;
  idx_t iVar18;
  void *in_R9;
  idx_t idx_in_entry;
  ulong uVar19;
  data_ptr_t pdVar20;
  optional_idx dict_size;
  undefined1 in_stack_ffffffffffffff48;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  Vector *local_98;
  idx_t local_90;
  unsigned_short *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  local_78.sel = (SelectionVector *)state[1]._vptr_ExpressionState;
  optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid
            ((optional_ptr<duckdb::FunctionLocalState,_true> *)&local_78);
  ArenaAllocator::Reset((ArenaAllocator *)&(local_78.sel)->selection_data);
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  count = args->count;
  VVar2 = vector->vector_type;
  if (VVar2 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    psVar7 = (string_t *)result->data;
    ldata = (unsigned_short *)vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    UnaryExecutor::
    ExecuteFlat<unsigned_short,duckdb::string_t,duckdb::UnaryLambdaWrapper,duckdb::StringDecompressFunction<unsigned_short>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_short_const&)_1_>
              (ldata,psVar7,count,&vector->validity,&result->validity,in_R9,
               (bool)in_stack_ffffffffffffff48);
    return;
  }
  if (VVar2 != DICTIONARY_VECTOR) {
    if (VVar2 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      puVar4 = (uint *)result->data;
      puVar5 = (ushort *)vector->data;
      puVar6 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar6 != (unsigned_long *)0x0) && ((*puVar6 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      uVar3 = *puVar5;
      *puVar4 = (uint)(byte)uVar3;
      *(ushort *)(puVar4 + 1) = uVar3 >> 8;
      *(undefined2 *)((long)puVar4 + 6) = 0;
      puVar4[2] = 0;
      puVar4[3] = 0;
      return;
    }
    goto LAB_00916876;
  }
  DictionaryVector::VerifyDictionary(vector);
  pVVar14 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector->buffer);
  local_78.sel = (SelectionVector *)pVVar14[1].data.allocator.ptr;
  if (((Allocator *)local_78.sel == (Allocator *)0xffffffffffffffff) ||
     (iVar17 = optional_idx::GetIndex((optional_idx *)&local_78), count < iVar17 * 2)) {
LAB_0091686c:
    bVar10 = false;
  }
  else {
    DictionaryVector::VerifyDictionary(vector);
    pVVar14 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector->auxiliary);
    if (*(char *)&pVVar14[1]._vptr_VectorBuffer != '\0') goto LAB_0091686c;
    local_98 = (Vector *)(pVVar14 + 1);
    psVar7 = (string_t *)result->data;
    local_88 = (unsigned_short *)pVVar14[1].data.pointer;
    local_90 = optional_idx::GetIndex((optional_idx *)&local_78);
    FlatVector::VerifyFlatVector(local_98);
    FlatVector::VerifyFlatVector(result);
    UnaryExecutor::
    ExecuteFlat<unsigned_short,duckdb::string_t,duckdb::UnaryLambdaWrapper,duckdb::StringDecompressFunction<unsigned_short>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_short_const&)_1_>
              (local_88,psVar7,local_90,(ValidityMask *)&pVVar14[1].data.allocated_size,
               &result->validity,in_R9,(bool)in_stack_ffffffffffffff48);
    DictionaryVector::VerifyDictionary(vector);
    pVVar14 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector->buffer);
    iVar17 = optional_idx::GetIndex((optional_idx *)&local_78);
    Vector::Dictionary(result,result,iVar17,(SelectionVector *)(pVVar14 + 1),count);
    bVar10 = true;
  }
  if (bVar10) {
    return;
  }
LAB_00916876:
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(vector,count,&local_78);
  Vector::SetVectorType(result,FLAT_VECTOR);
  pSVar13 = local_78.sel;
  pdVar20 = result->data;
  FlatVector::VerifyFlatVector(result);
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      p_Var8 = (allocate_function_ptr_t)pSVar13->sel_vector;
      pdVar20 = pdVar20 + 8;
      iVar17 = 0;
      do {
        iVar18 = iVar17;
        if (p_Var8 != (allocate_function_ptr_t)0x0) {
          iVar18 = (idx_t)*(uint *)(p_Var8 + iVar17 * 4);
        }
        uVar3 = *(ushort *)(local_78.data + iVar18 * 2);
        *(uint *)(pdVar20 + -8) = (uint)(byte)uVar3;
        *(ushort *)(pdVar20 + -4) = uVar3 >> 8;
        pdVar20[-2] = '\0';
        pdVar20[-1] = '\0';
        pdVar20[0] = '\0';
        pdVar20[1] = '\0';
        pdVar20[2] = '\0';
        pdVar20[3] = '\0';
        pdVar20[4] = '\0';
        pdVar20[5] = '\0';
        pdVar20[6] = '\0';
        pdVar20[7] = '\0';
        iVar17 = iVar17 + 1;
        pdVar20 = pdVar20 + 0x10;
      } while (count != iVar17);
    }
  }
  else if (count != 0) {
    p_Var8 = (allocate_function_ptr_t)pSVar13->sel_vector;
    pdVar20 = pdVar20 + 8;
    uVar19 = 0;
    do {
      uVar15 = uVar19;
      if (p_Var8 != (allocate_function_ptr_t)0x0) {
        uVar15 = (ulong)*(uint *)(p_Var8 + uVar19 * 4);
      }
      if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar15 >> 6]
           >> (uVar15 & 0x3f) & 1) == 0) {
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_a8,&local_80);
          p_Var12 = p_Stack_a0;
          peVar11 = local_a8;
          local_a8 = (element_type *)0x0;
          p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar11;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var12;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
          }
          pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar16->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar9 = (byte)uVar19 & 0x3f;
        puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (uVar19 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
      }
      else {
        uVar3 = *(ushort *)(local_78.data + uVar15 * 2);
        *(uint *)(pdVar20 + -8) = (uint)(byte)uVar3;
        *(ushort *)(pdVar20 + -4) = uVar3 >> 8;
        pdVar20[-2] = '\0';
        pdVar20[-1] = '\0';
        pdVar20[0] = '\0';
        pdVar20[1] = '\0';
        pdVar20[2] = '\0';
        pdVar20[3] = '\0';
        pdVar20[4] = '\0';
        pdVar20[5] = '\0';
        pdVar20[6] = '\0';
        pdVar20[7] = '\0';
      }
      uVar19 = uVar19 + 1;
      pdVar20 = pdVar20 + 0x10;
    } while (count != uVar19);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void StringDecompressFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &allocator = ExecuteFunctionState::GetFunctionState(state)->Cast<StringDecompressLocalState>().allocator;
	allocator.Reset();
	UnaryExecutor::Execute<INPUT_TYPE, string_t>(
	    args.data[0], result, args.size(),
	    [&](const INPUT_TYPE &input) { return StringDecompress<INPUT_TYPE>(input, allocator); },
	    FunctionErrors::CANNOT_ERROR);
}